

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void testing::internal::PrintCharsAsStringTo(char *begin,size_t len,ostream *os)

{
  ulong local_28;
  size_t index;
  ostream *os_local;
  size_t len_local;
  char *begin_local;
  
  std::operator<<(os,"\"");
  for (local_28 = 0; local_28 < len; local_28 = local_28 + 1) {
    PrintAsStringLiteralTo(begin[local_28],os);
  }
  std::operator<<(os,"\"");
  return;
}

Assistant:

static void PrintCharsAsStringTo(const char* begin, size_t len, ostream* os) {
  *os << "\"";
  for (size_t index = 0; index < len; ++index) {
    PrintAsStringLiteralTo(begin[index], os);
  }
  *os << "\"";
}